

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall
cashew::ValueBuilder::appendToObjectAsGetter(ValueBuilder *this,Ref array,IString key,Ref value)

{
  bool bVar1;
  Ref *pRVar2;
  Value *this_00;
  Value *pVVar3;
  Value *pVVar4;
  Ref RVar5;
  Ref local_48;
  Ref local_40;
  Ref local_38;
  Ref local_30;
  Ref local_28;
  Ref value_local;
  IString key_local;
  Ref array_local;
  
  local_28.inst = (Value *)key.str._M_str;
  key_local.str._M_len = key.str._M_len;
  value_local = array;
  key_local.str._M_str = (char *)this;
  pRVar2 = Ref::operator[]((Ref *)&key_local.str._M_str,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)OBJECT);
  if (!bVar1) {
    __assert_fail("array[0] == OBJECT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x739,
                  "static void cashew::ValueBuilder::appendToObjectAsGetter(Ref, IString, Ref)");
  }
  pRVar2 = Ref::operator[]((Ref *)&key_local.str._M_str,1);
  this_00 = Ref::operator->(pRVar2);
  local_38 = makeRawArray(2);
  pVVar3 = Ref::operator->(&local_38);
  local_48 = makeRawArray(2);
  pVVar4 = Ref::operator->(&local_48);
  RVar5 = makeRawString((IString *)GETTER);
  pVVar4 = cashew::Value::push_back(pVVar4,RVar5);
  RVar5 = makeRawString((IString *)&value_local);
  pVVar4 = cashew::Value::push_back(pVVar4,RVar5);
  Ref::Ref(&local_40,pVVar4);
  pVVar3 = cashew::Value::push_back(pVVar3,local_40);
  pVVar3 = cashew::Value::push_back(pVVar3,local_28);
  Ref::Ref(&local_30,pVVar3);
  cashew::Value::push_back(this_00,local_30);
  return;
}

Assistant:

static void appendToObjectAsGetter(Ref array, IString key, Ref value) {
    assert(array[0] == OBJECT);
    array[1]->push_back(&makeRawArray(2)
                           ->push_back(&makeRawArray(2)
                                          ->push_back(makeRawString(GETTER))
                                          .push_back(makeRawString(key)))
                           .push_back(value));
  }